

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

QString * QtPrivate::QCalendarDateSectionValidator::highlightString(QString *str,int pos)

{
  long lVar1;
  int iVar2;
  qsizetype qVar3;
  int in_EDX;
  QStringView *in_RSI;
  QStringBuilder<QStringBuilder<QStringView,_QLatin1String>,_QStringView> *in_RDI;
  long in_FS_OFFSET;
  int startPos;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringView,_QLatin1String>,_QStringView>,_QLatin1String>
  *in_stack_fffffffffffffe78;
  QStringBuilder<QStringBuilder<QStringView,_QLatin1String>,_QStringView> *pQVar4;
  QStringBuilder<QStringBuilder<QStringView,_QLatin1String>,_QStringView> *n;
  qsizetype in_stack_fffffffffffffea8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  if (in_EDX == 0) {
    Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)in_RDI);
    ::operator+((QLatin1String *)in_RDI,(QString *)in_stack_fffffffffffffe78);
    Qt::Literals::StringLiterals::operator____L1((char *)pQVar4,(size_t)in_RDI);
    ::operator+((QStringBuilder<QLatin1String,_const_QString_&> *)in_RDI,
                (QLatin1String *)in_stack_fffffffffffffe78);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String> *)
               in_stack_fffffffffffffe78);
  }
  else {
    n = in_RDI;
    qVar3 = QString::size((QString *)in_RSI);
    iVar2 = (int)qVar3 - in_EDX;
    QStringView::QStringView<QString,_true>((QStringView *)CONCAT44(in_EDX,iVar2),(QString *)pQVar4)
    ;
    QStringView::mid(in_RSI,in_stack_fffffffffffffea8,(qsizetype)n);
    Qt::Literals::StringLiterals::operator____L1((char *)pQVar4,(size_t)in_RDI);
    ::operator+((QStringView *)in_RDI,(QLatin1String *)in_stack_fffffffffffffe78);
    QStringView::QStringView<QString,_true>((QStringView *)CONCAT44(in_EDX,iVar2),(QString *)pQVar4)
    ;
    QStringView::mid(in_RSI,in_stack_fffffffffffffea8,(qsizetype)n);
    ::operator+(&in_RDI->a,(QStringView *)in_stack_fffffffffffffe78);
    Qt::Literals::StringLiterals::operator____L1((char *)pQVar4,(size_t)in_RDI);
    ::operator+(in_RDI,(QLatin1String *)in_stack_fffffffffffffe78);
    ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QString QCalendarDateSectionValidator::highlightString(const QString &str, int pos)
{
    if (pos == 0)
        return "<b>"_L1 + str + "</b>"_L1;
    int startPos = str.size() - pos;
    return QStringView{str}.mid(0, startPos) + "<b>"_L1 + QStringView{str}.mid(startPos, pos) + "</b>"_L1;

}